

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

int nni_chunk_grow(nni_chunk *ch,size_t newsz,size_t headwanted)

{
  uint8_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  uint8_t *puVar4;
  size_t sVar5;
  int iVar6;
  ulong uVar7;
  
  if (newsz < ch->ch_len) {
    newsz = ch->ch_len;
  }
  puVar4 = ch->ch_buf;
  puVar1 = ch->ch_ptr;
  uVar3 = (long)puVar1 - (long)puVar4;
  if ((puVar1 == (uint8_t *)0x0 || puVar1 < puVar4) ||
     (uVar2 = ch->ch_cap, puVar4 + uVar2 <= puVar1)) {
    uVar3 = newsz + headwanted;
    if (ch->ch_cap <= uVar3) {
      puVar4 = (uint8_t *)nni_zalloc(uVar3);
      if (puVar4 == (uint8_t *)0x0) goto LAB_00114f77;
      nni_free(ch->ch_buf,ch->ch_cap);
      ch->ch_cap = uVar3;
      ch->ch_buf = puVar4;
    }
    ch->ch_ptr = ch->ch_buf + headwanted;
    iVar6 = 0;
  }
  else {
    sVar5 = headwanted;
    if (headwanted < uVar3) {
      sVar5 = uVar3;
    }
    if (headwanted <= uVar3 && sVar5 + newsz <= uVar2) {
      return 0;
    }
    uVar7 = uVar2 - uVar3;
    if (uVar2 - uVar3 < newsz) {
      uVar7 = newsz;
    }
    puVar4 = (uint8_t *)nni_zalloc(uVar7 + sVar5);
    if (puVar4 != (uint8_t *)0x0) {
      if (ch->ch_len != 0) {
        memcpy(puVar4 + sVar5,ch->ch_ptr,ch->ch_len);
      }
      nni_free(ch->ch_buf,ch->ch_cap);
      ch->ch_buf = puVar4;
      ch->ch_ptr = puVar4 + sVar5;
      ch->ch_cap = uVar7 + sVar5;
      return 0;
    }
LAB_00114f77:
    iVar6 = 2;
  }
  return iVar6;
}

Assistant:

static int
nni_chunk_grow(nni_chunk *ch, size_t newsz, size_t headwanted)
{
	uint8_t *newbuf;

	// We assume that if the pointer is a valid pointer, and inside
	// the backing store, then the entire data length fits.  In this
	// case we perform a logical realloc, except we don't copy any
	// unreferenced data.  We do preserve the headroom of the previous
	// use, since that may be there for a reason.
	//
	// The test below also covers the case where the pointers are both
	// NULL, or the capacity is zero.

	// No shrinking (violets)
	if (newsz < ch->ch_len) {
		newsz = ch->ch_len;
	}

	if ((ch->ch_ptr >= ch->ch_buf) && (ch->ch_ptr != NULL) &&
	    (ch->ch_ptr < (ch->ch_buf + ch->ch_cap))) {
		size_t headroom = (size_t) (ch->ch_ptr - ch->ch_buf);
		if (headwanted < headroom) {
			headwanted = headroom; // Never shrink this.
		}
		if (((newsz + headwanted) <= ch->ch_cap) &&
		    (headwanted <= headroom)) {
			// We have enough space at the ends already.
			return (0);
		}
		// Make sure we allocate at least as much tail room as we
		// previously had.

		if (newsz < (ch->ch_cap - headroom)) {
			newsz = ch->ch_cap - headroom;
		}

		if ((newbuf = nni_zalloc(newsz + headwanted)) == NULL) {
			return (NNG_ENOMEM);
		}
		// Copy all the data, but not header or trailer.
		if (ch->ch_len > 0) {
			memcpy(newbuf + headwanted, ch->ch_ptr, ch->ch_len);
		}
		nni_free(ch->ch_buf, ch->ch_cap);
		ch->ch_buf = newbuf;
		ch->ch_ptr = newbuf + headwanted;
		ch->ch_cap = newsz + headwanted;
		return (0);
	}

	// We either don't have a data pointer yet, or it doesn't reference
	// the backing store.  In this case, we just check against the
	// allocated capacity and grow, or don't grow.
	if ((newsz + headwanted) >= ch->ch_cap) {
		if ((newbuf = nni_zalloc(newsz + headwanted)) == NULL) {
			return (NNG_ENOMEM);
		}
		nni_free(ch->ch_buf, ch->ch_cap);
		ch->ch_cap = newsz + headwanted;
		ch->ch_buf = newbuf;
	}

	ch->ch_ptr = ch->ch_buf + headwanted;
	return (0);
}